

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::StructDatePart::Function<duckdb::date_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  pointer pplVar1;
  undefined8 *puVar2;
  value_type vVar3;
  idx_t count;
  pointer puVar4;
  unsigned_long *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  date_t *input;
  byte bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  BoundFunctionExpression *pBVar11;
  pointer pFVar12;
  reference this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference pvVar13;
  reference pvVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  reference ppdVar17;
  reference pvVar18;
  pointer pVVar19;
  type pVVar20;
  long lVar21;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_entry;
  ulong uVar22;
  size_type sVar23;
  value_type pdVar24;
  ulong uVar25;
  size_type sVar26;
  pointer puVar27;
  idx_t entry_idx_1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *__range5;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_entry_1;
  part_codes_t *part_codes;
  int iVar29;
  undefined1 auVar28 [16];
  int iVar30;
  idx_t last_entry_index;
  vector<unsigned_long,_true> owners;
  UnifiedVectorFormat rdata;
  undefined1 local_108 [24];
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_f0;
  idx_t local_e8;
  buffer_ptr<ValidityBuffer> *local_e0;
  undefined1 local_d8 [16];
  pointer local_c8;
  part_mask_t local_b8;
  data_ptr_t local_b0;
  vector<double_*,_true> local_a8;
  vector<long_*,_true> local_90;
  UnifiedVectorFormat local_78;
  
  pBVar11 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar12 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar11->bind_info);
  count = args->count;
  this = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  local_90.super_vector<long_*,_std::allocator<long_*>_>.
  super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0xb0);
  pplVar1 = local_90.super_vector<long_*,_std::allocator<long_*>_>.
            super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data.
            _M_start + 0x16;
  local_90.super_vector<long_*,_std::allocator<long_*>_>.
  super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pplVar1;
  switchD_00569a20::default
            (local_90.super_vector<long_*,_std::allocator<long_*>_>.
             super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data.
             _M_start,0,0xb0);
  local_90.super_vector<long_*,_std::allocator<long_*>_>.
  super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data._M_finish =
       pplVar1;
  local_a8.super_vector<double_*,_std::allocator<double_*>_>.
  super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(0x10);
  local_a8.super_vector<double_*,_std::allocator<double_*>_>.
  super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)((long)local_a8.super_vector<double_*,_std::allocator<double_*>_>.
                         super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x10);
  *(undefined1 (*) [16])
   local_a8.super_vector<double_*,_std::allocator<double_*>_>.
   super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data._M_start
       = (undefined1  [16])0x0;
  part_codes = (part_codes_t *)(pFVar12 + 4);
  local_a8.super_vector<double_*,_std::allocator<double_*>_>.
  super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_a8.super_vector<double_*,_std::allocator<double_*>_>.
       super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_b8 = DatePart::StructOperator::GetMask(part_codes);
  this_00 = StructVector::GetEntries(result);
  puVar27 = (this_00->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this_00->
           super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (pointer)0x0;
  local_d8._0_8_ = operator_new(0xc0);
  uVar22 = (long)puVar4 - (long)puVar27;
  local_c8 = (pointer)(local_d8._0_8_ + 0xc0);
  iVar29 = (int)(uVar22 >> 0x20);
  iVar30 = iVar29 >> 3;
  auVar28._8_4_ = (int)uVar22;
  auVar28._0_8_ = uVar22;
  auVar28._12_4_ = iVar29;
  lVar21 = 0;
  do {
    puVar2 = (undefined8 *)(local_d8._0_8_ + lVar21 * 8);
    *puVar2 = CONCAT44(iVar30,(int)(uVar22 >> 3));
    *(int *)(puVar2 + 2) = (int)(auVar28._8_8_ >> 3);
    *(int *)((long)puVar2 + 0x14) = iVar30;
    lVar21 = lVar21 + 2;
  } while (lVar21 != 0x18);
  local_d8._8_8_ = local_c8;
  if ((this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar23 = 0;
    do {
      pvVar13 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar23);
      vVar3 = *pvVar13;
      pvVar14 = vector<unsigned_long,_true>::operator[]
                          ((vector<unsigned_long,_true> *)local_d8,(ulong)vVar3);
      uVar22 = (long)(this_00->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (*pvVar14 == uVar22) {
        pvVar14 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)local_d8,(ulong)vVar3);
        *pvVar14 = sVar23;
        uVar22 = (long)(this_00->
                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this_00->
                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
      }
      sVar23 = sVar23 + 1;
    } while (sVar23 < uVar22);
  }
  if (this->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar5 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      if ((this_00->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_00->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar26 = 0;
        do {
          pvVar18 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this_00,sVar26);
          pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (pvVar18);
          ConstantVector::SetNull(pVVar20,false);
          pvVar13 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar26);
          uVar22 = (ulong)*pvVar13;
          pvVar14 = vector<unsigned_long,_true>::operator[]
                              ((vector<unsigned_long,_true> *)local_d8,uVar22);
          if (sVar26 == *pvVar14) {
            pvVar13 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar26);
            if (*pvVar13 < BEGIN_DOUBLE) {
              pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar18);
              pdVar24 = (value_type)pVVar20->data;
              ppdVar17 = (reference)vector<long_*,_true>::operator[](&local_90,uVar22);
            }
            else {
              pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar18);
              pdVar24 = (value_type)pVVar20->data;
              ppdVar17 = vector<double_*,_true>::operator[](&local_a8,uVar22 - 0x16);
            }
            *ppdVar17 = pdVar24;
          }
          sVar26 = sVar26 + 1;
        } while (sVar26 < (ulong)((long)(this_00->
                                        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->
                                        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      input = (date_t *)this->data;
      bVar10 = Value::IsFinite<duckdb::date_t>((date_t)input->days);
      if (bVar10) {
        DatePart::StructOperator::Operation<duckdb::date_t>(&local_90,&local_a8,input,0,local_b8);
      }
      else {
        puVar4 = (this_00->
                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar27 = (this_00->
                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar27 != puVar4;
            puVar27 = puVar27 + 1) {
          pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (puVar27);
          ConstantVector::SetNull(pVVar20,true);
        }
      }
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(this,count,&local_78);
    local_b0 = local_78.data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    FlatVector::VerifyFlatVector(result);
    puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (count != 0 && puVar5 != (unsigned_long *)0x0) {
      uVar22 = count + 0x3f >> 6;
      if (uVar22 != 1) {
        switchD_00569a20::default(puVar5,0xff,uVar22 * 8 - 8);
      }
      puVar5[uVar22 - 1] =
           puVar5[uVar22 - 1] | -(ulong)((count & 0x3f) == 0) | ~(-1L << ((byte)count & 0x3f));
    }
    if ((this_00->
        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this_00->
        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar22 = count + 0x3f >> 6;
      local_f0 = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  *)(uVar22 - 1);
      local_e0 = (buffer_ptr<ValidityBuffer> *)(uVar22 * 8 + -8);
      sVar26 = 0;
      do {
        pvVar18 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_00,sVar26);
        pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (pvVar18);
        Vector::SetVectorType(pVVar19,FLAT_VECTOR);
        pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (pvVar18);
        FlatVector::VerifyFlatVector(pVVar20);
        puVar5 = (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 != (unsigned_long *)0x0 && count != 0) {
          if (local_f0 !=
              (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               *)0x0) {
            switchD_00569a20::default(puVar5,0xff,(size_t)local_e0);
          }
          puVar5[uVar22 - 1] =
               puVar5[uVar22 - 1] | -(ulong)((count & 0x3f) == 0) | ~(-1L << ((byte)count & 0x3f));
        }
        pvVar13 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar26);
        uVar25 = (ulong)*pvVar13;
        pvVar14 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)local_d8,uVar25);
        if (sVar26 == *pvVar14) {
          pvVar13 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar26);
          if (*pvVar13 < BEGIN_DOUBLE) {
            pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar18);
            pdVar24 = (value_type)pVVar20->data;
            ppdVar17 = (reference)vector<long_*,_true>::operator[](&local_90,uVar25);
          }
          else {
            pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar18);
            pdVar24 = (value_type)pVVar20->data;
            ppdVar17 = vector<double_*,_true>::operator[](&local_a8,uVar25 - 0x16);
          }
          *ppdVar17 = pdVar24;
        }
        sVar26 = sVar26 + 1;
      } while (sVar26 < (ulong)((long)(this_00->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    local_f0 = this_00;
    if (count != 0) {
      local_e0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar22 = 0;
      do {
        uVar25 = uVar22;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)(local_78.sel)->sel_vector[uVar22];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar25 >> 6]
             >> (uVar25 & 0x3f) & 1) != 0)) {
          bVar10 = Value::IsFinite<duckdb::date_t>((date_t)*(int32_t *)(local_b0 + uVar25 * 4));
          if (bVar10) {
            DatePart::StructOperator::Operation<duckdb::date_t>
                      (&local_90,&local_a8,(date_t *)(local_b0 + uVar25 * 4),uVar22,local_b8);
          }
          else {
            puVar27 = (local_f0->
                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar4 = (local_f0->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (puVar27 != puVar4) {
              bVar7 = (byte)uVar22 & 0x3f;
              do {
                pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                          operator*(puVar27);
                FlatVector::VerifyFlatVector(pVVar20);
                _Var16._M_head_impl =
                     (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_e8 = (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.capacity
                  ;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_108,&local_e8);
                  uVar8 = local_108._0_8_;
                  uVar9 = local_108._8_8_;
                  local_108._0_16_ = (undefined1  [16])0x0;
                  p_Var6 = (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)uVar8;
                  (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
                    }
                  }
                  pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(pVVar20->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var16._M_head_impl =
                       (pTVar15->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                _Var16._M_head_impl[uVar22 >> 6] =
                     _Var16._M_head_impl[uVar22 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
                puVar27 = puVar27 + 1;
              } while (puVar27 != puVar4);
            }
          }
        }
        else {
          _Var16._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var16._M_head_impl == (unsigned_long *)0x0) {
            local_e8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_108,&local_e8);
            uVar8 = local_108._0_8_;
            uVar9 = local_108._8_8_;
            local_108._0_16_ = (undefined1  [16])0x0;
            p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar8;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
              }
            }
            pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_e0);
            _Var16._M_head_impl =
                 (pTVar15->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var16._M_head_impl;
          }
          bVar7 = (byte)uVar22 & 0x3f;
          uVar25 = -2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7;
          _Var16._M_head_impl[uVar22 >> 6] = _Var16._M_head_impl[uVar22 >> 6] & uVar25;
          puVar4 = (local_f0->
                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar27 = (local_f0->
                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar27 != puVar4;
              puVar27 = puVar27 + 1) {
            pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(puVar27);
            FlatVector::VerifyFlatVector(pVVar20);
            _Var16._M_head_impl =
                 (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var16._M_head_impl == (unsigned_long *)0x0) {
              local_e8 = (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_108,&local_e8);
              uVar8 = local_108._0_8_;
              uVar9 = local_108._8_8_;
              local_108._0_16_ = (undefined1  [16])0x0;
              p_Var6 = (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)uVar8;
              (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
                }
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var16._M_head_impl =
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (pVVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var16._M_head_impl;
            }
            _Var16._M_head_impl[uVar22 >> 6] = _Var16._M_head_impl[uVar22 >> 6] & uVar25;
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != count);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    this_00 = local_f0;
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if ((this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar23 = 0;
    do {
      pvVar13 = vector<duckdb::DatePartSpecifier,_true>::operator[](part_codes,sVar23);
      pvVar14 = vector<unsigned_long,_true>::operator[]
                          ((vector<unsigned_long,_true> *)local_d8,(ulong)*pvVar13);
      sVar26 = *pvVar14;
      if (sVar23 != sVar26) {
        pvVar18 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_00,sVar23);
        pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (pvVar18);
        pvVar18 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this_00,sVar26);
        pVVar20 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (pvVar18);
        Vector::Reference(pVVar19,pVVar20);
      }
      sVar23 = sVar23 + 1;
    } while (sVar23 < (ulong)((long)(this_00->
                                    super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->
                                    super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  Vector::Verify(result,count);
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((undefined1 (*) [16])
      local_a8.super_vector<double_*,_std::allocator<double_*>_>.
      super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (undefined1 (*) [16])0x0) {
    operator_delete(local_a8.super_vector<double_*,_std::allocator<double_*>_>.
                    super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.super_vector<long_*,_std::allocator<long_*>_>.
      super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_90.super_vector<long_*,_std::allocator<long_*>_>.
                    super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void Function(DataChunk &args, ExpressionState &state, Vector &result) {
		auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
		auto &info = func_expr.bind_info->Cast<BindData>();
		D_ASSERT(args.ColumnCount() == 1);

		const auto count = args.size();
		Vector &input = args.data[0];

		//	Type counts
		const auto BIGINT_COUNT = size_t(DatePartSpecifier::BEGIN_DOUBLE) - size_t(DatePartSpecifier::BEGIN_BIGINT);
		const auto DOUBLE_COUNT = size_t(DatePartSpecifier::BEGIN_INVALID) - size_t(DatePartSpecifier::BEGIN_DOUBLE);
		DatePart::StructOperator::bigint_vec bigint_values(BIGINT_COUNT, nullptr);
		DatePart::StructOperator::double_vec double_values(DOUBLE_COUNT, nullptr);
		const auto part_mask = DatePart::StructOperator::GetMask(info.part_codes);

		auto &child_entries = StructVector::GetEntries(result);

		// The first computer of a part "owns" it
		// and other requestors just reference the owner
		vector<size_t> owners(int(DatePartSpecifier::JULIAN_DAY) + 1, child_entries.size());
		for (size_t col = 0; col < child_entries.size(); ++col) {
			const auto part_index = size_t(info.part_codes[col]);
			if (owners[part_index] == child_entries.size()) {
				owners[part_index] = col;
			}
		}

		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				for (size_t col = 0; col < child_entries.size(); ++col) {
					auto &child_entry = child_entries[col];
					ConstantVector::SetNull(*child_entry, false);
					const auto part_index = size_t(info.part_codes[col]);
					if (owners[part_index] == col) {
						if (IsBigintDatepart(info.part_codes[col])) {
							bigint_values[part_index - size_t(DatePartSpecifier::BEGIN_BIGINT)] =
							    ConstantVector::GetData<int64_t>(*child_entry);
						} else {
							double_values[part_index - size_t(DatePartSpecifier::BEGIN_DOUBLE)] =
							    ConstantVector::GetData<double>(*child_entry);
						}
					}
				}
				auto tdata = ConstantVector::GetData<INPUT_TYPE>(input);
				if (Value::IsFinite(tdata[0])) {
					DatePart::StructOperator::Operation(bigint_values, double_values, tdata[0], 0, part_mask);
				} else {
					for (auto &child_entry : child_entries) {
						ConstantVector::SetNull(*child_entry, true);
					}
				}
			}
		} else {
			UnifiedVectorFormat rdata;
			input.ToUnifiedFormat(count, rdata);

			const auto &arg_valid = rdata.validity;
			auto tdata = UnifiedVectorFormat::GetData<INPUT_TYPE>(rdata);

			// Start with a valid flat vector
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto &res_valid = FlatVector::Validity(result);
			if (res_valid.GetData()) {
				res_valid.SetAllValid(count);
			}

			// Start with valid children
			for (size_t col = 0; col < child_entries.size(); ++col) {
				auto &child_entry = child_entries[col];
				child_entry->SetVectorType(VectorType::FLAT_VECTOR);
				auto &child_validity = FlatVector::Validity(*child_entry);
				if (child_validity.GetData()) {
					child_validity.SetAllValid(count);
				}

				// Pre-multiplex
				const auto part_index = size_t(info.part_codes[col]);
				if (owners[part_index] == col) {
					if (IsBigintDatepart(info.part_codes[col])) {
						bigint_values[part_index - size_t(DatePartSpecifier::BEGIN_BIGINT)] =
						    FlatVector::GetData<int64_t>(*child_entry);
					} else {
						double_values[part_index - size_t(DatePartSpecifier::BEGIN_DOUBLE)] =
						    FlatVector::GetData<double>(*child_entry);
					}
				}
			}

			for (idx_t i = 0; i < count; ++i) {
				const auto idx = rdata.sel->get_index(i);
				if (arg_valid.RowIsValid(idx)) {
					if (Value::IsFinite(tdata[idx])) {
						DatePart::StructOperator::Operation(bigint_values, double_values, tdata[idx], i, part_mask);
					} else {
						for (auto &child_entry : child_entries) {
							FlatVector::Validity(*child_entry).SetInvalid(i);
						}
					}
				} else {
					res_valid.SetInvalid(i);
					for (auto &child_entry : child_entries) {
						FlatVector::Validity(*child_entry).SetInvalid(i);
					}
				}
			}
		}

		// Reference any duplicate parts
		for (size_t col = 0; col < child_entries.size(); ++col) {
			const auto part_index = size_t(info.part_codes[col]);
			const auto owner = owners[part_index];
			if (owner != col) {
				child_entries[col]->Reference(*child_entries[owner]);
			}
		}

		result.Verify(count);
	}